

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O2

void __thiscall Dependency::FixDependentFile(Dependency *this,string *dependent_file)

{
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symlink;
  pointer pbVar3;
  string sStack_68;
  string local_48;
  
  OriginalPath_abi_cxx11_(&sStack_68,this);
  InnerPath_abi_cxx11_(&local_48,this);
  changeInstallName(dependent_file,&sStack_68,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  pbVar1 = (this->symlinks).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->symlinks).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    InnerPath_abi_cxx11_(&sStack_68,this);
    changeInstallName(dependent_file,pbVar3,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  bVar2 = Settings::missingPrefixes();
  if (bVar2) {
    InnerPath_abi_cxx11_(&sStack_68,this);
    changeInstallName(dependent_file,&this->filename,&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
    pbVar1 = (this->symlinks).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (this->symlinks).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      InnerPath_abi_cxx11_(&sStack_68,this);
      changeInstallName(dependent_file,pbVar3,&sStack_68);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
  }
  return;
}

Assistant:

void Dependency::FixDependentFile(const string& dependent_file) const
{
    changeInstallName(dependent_file, OriginalPath(), InnerPath());
    for (const auto& symlink : symlinks)
    {
        changeInstallName(dependent_file, symlink, InnerPath());
    }

    if (!Settings::missingPrefixes()) return;

    changeInstallName(dependent_file, filename, InnerPath());
    for (const auto& symlink : symlinks)
    {
        changeInstallName(dependent_file, symlink, InnerPath());
    }
}